

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O3

EvaluatedTargetPropertyEntries *
EvaluateTargetPropertyEntries
          (EvaluatedTargetPropertyEntries *__return_storage_ptr__,cmGeneratorTarget *thisTarget,
          string *config,string *lang,cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
          *in)

{
  pointer puVar1;
  pointer puVar2;
  EvaluatedTargetPropertyEntry local_68;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Entries).
           super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->Entries).
           super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->Entries).
  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Entries).
  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::reserve
            (&__return_storage_ptr__->Entries,
             (long)(in->
                   super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(in->
                   super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (in->
           super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (in->
           super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      EvaluateTargetPropertyEntry
                (&local_68,thisTarget,config,lang,dagChecker,
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 .super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
                 _M_head_impl);
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      emplace_back<EvaluatedTargetPropertyEntry>(&__return_storage_ptr__->Entries,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68.Values);
      if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

EvaluatedTargetPropertyEntries EvaluateTargetPropertyEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& lang, cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry>> const&
    in)
{
  EvaluatedTargetPropertyEntries out;
  out.Entries.reserve(in.size());
  for (auto const& entry : in) {
    out.Entries.emplace_back(EvaluateTargetPropertyEntry(
      thisTarget, config, lang, dagChecker, *entry));
  }
  return out;
}